

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_pack4.h
# Opt level: O3

void ncnn::convdw3x3s1_pack4_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined1 (*pauVar1) [12];
  undefined8 *puVar2;
  float *pfVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  uint uVar7;
  int iVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  undefined8 uVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  undefined1 auVar65 [12];
  undefined1 auVar66 [12];
  undefined1 auVar67 [12];
  undefined1 auVar68 [12];
  undefined1 auVar69 [12];
  undefined1 auVar70 [12];
  undefined1 auVar71 [12];
  undefined1 auVar72 [12];
  undefined1 auVar73 [12];
  int iVar74;
  uint uVar75;
  uint uVar76;
  long lVar77;
  float *pfVar78;
  float *pfVar79;
  int iVar80;
  long lVar81;
  long lVar82;
  float *pfVar83;
  float *pfVar84;
  float *pfVar85;
  float *pfVar86;
  undefined1 (*pauVar87) [16];
  void *pvVar88;
  int *piVar93;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar94 [16];
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_6c;
  
  iVar6 = bottom_blob->c;
  if (0 < (long)iVar6) {
    uVar7 = top_blob->w;
    iVar8 = top_blob->h;
    lVar81 = 0;
    do {
      if (_bias == (Mat *)0x0) {
        pvVar88 = (void *)0x0;
        piVar93 = (int *)0x0;
      }
      else {
        pvVar88 = (&_bias->data)[lVar81 * 2];
        piVar93 = (int *)(&_bias->data + lVar81 * 2)[1];
      }
      local_118 = SUB84(pvVar88,0);
      fStack_114 = (float)((ulong)pvVar88 >> 0x20);
      fStack_110 = SUB84(piVar93,0);
      fStack_10c = (float)((ulong)piVar93 >> 0x20);
      if (0 < iVar8) {
        pauVar87 = (undefined1 (*) [16])
                   (top_blob->cstep * lVar81 * top_blob->elemsize + (long)top_blob->data);
        lVar77 = kernel->w * lVar81 * kernel->elemsize;
        pvVar88 = kernel->data;
        pauVar1 = (undefined1 (*) [12])((long)pvVar88 + lVar77);
        auVar70 = *pauVar1;
        auVar68 = *pauVar1;
        local_f8 = (float)*(undefined8 *)*pauVar1;
        fStack_f4 = (float)((ulong)*(undefined8 *)*pauVar1 >> 0x20);
        fStack_f0 = (float)*(undefined8 *)(*pauVar1 + 8);
        fStack_ec = (float)((ulong)*(undefined8 *)(*pauVar1 + 8) >> 0x20);
        pauVar1 = (undefined1 (*) [12])((long)pvVar88 + lVar77 + 0x10);
        auVar71 = *pauVar1;
        auVar66 = *pauVar1;
        local_e8 = (float)*(undefined8 *)*pauVar1;
        fStack_e4 = (float)((ulong)*(undefined8 *)*pauVar1 >> 0x20);
        fStack_e0 = (float)*(undefined8 *)(*pauVar1 + 8);
        fStack_dc = (float)((ulong)*(undefined8 *)(*pauVar1 + 8) >> 0x20);
        pauVar1 = (undefined1 (*) [12])((long)pvVar88 + lVar77 + 0x20);
        auVar72 = *pauVar1;
        auVar67 = *pauVar1;
        auVar65 = *pauVar1;
        local_d8 = (float)*(undefined8 *)*pauVar1;
        fStack_d4 = (float)((ulong)*(undefined8 *)*pauVar1 >> 0x20);
        fStack_d0 = (float)*(undefined8 *)(*pauVar1 + 8);
        fStack_cc = (float)((ulong)*(undefined8 *)(*pauVar1 + 8) >> 0x20);
        auVar4 = *(undefined1 (*) [16])((long)pvVar88 + lVar77 + 0x30);
        auVar5 = *(undefined1 (*) [16])((long)pvVar88 + lVar77 + 0x40);
        pfVar85 = (float *)((long)pvVar88 + lVar77 + 0x50);
        fVar57 = *pfVar85;
        fVar58 = pfVar85[1];
        fVar59 = pfVar85[2];
        fVar60 = pfVar85[3];
        pauVar1 = (undefined1 (*) [12])((long)pvVar88 + lVar77 + 0x60);
        fVar45 = *(float *)*pauVar1;
        fVar46 = *(float *)(*pauVar1 + 4);
        fVar47 = *(float *)(*pauVar1 + 8);
        auVar73 = *pauVar1;
        fVar48 = *(float *)pauVar1[1];
        pfVar85 = (float *)((long)pvVar88 + lVar77 + 0x70);
        fVar49 = *pfVar85;
        fVar50 = pfVar85[1];
        fVar51 = pfVar85[2];
        fVar52 = pfVar85[3];
        pfVar85 = (float *)((long)pvVar88 + lVar77 + 0x80);
        fVar53 = *pfVar85;
        fVar54 = pfVar85[1];
        fVar55 = pfVar85[2];
        fVar56 = pfVar85[3];
        pfVar85 = (float *)(bottom_blob->cstep * lVar81 * bottom_blob->elemsize +
                           (long)bottom_blob->data);
        lVar77 = (long)bottom_blob->w * bottom_blob->elemsize;
        pfVar78 = (float *)(lVar77 * 2 + (long)pfVar85);
        pfVar83 = (float *)(lVar77 + (long)pfVar85);
        iVar80 = 0;
        do {
          local_148 = auVar4._0_4_;
          fStack_144 = auVar4._4_4_;
          fStack_13c = auVar4._12_4_;
          local_128 = auVar5._0_4_;
          fStack_124 = auVar5._4_4_;
          fStack_120 = auVar5._8_4_;
          fStack_11c = auVar5._12_4_;
          fStack_140 = auVar4._8_4_;
          if ((int)uVar7 < 8) {
            uVar76 = 0;
          }
          else {
            iVar74 = 7;
            do {
              fVar9 = pfVar85[1];
              fVar10 = pfVar85[2];
              fVar11 = pfVar85[3];
              fVar12 = pfVar85[4];
              fVar13 = pfVar85[5];
              fVar14 = pfVar85[6];
              fVar15 = pfVar85[7];
              fVar16 = pfVar85[8];
              fVar17 = pfVar85[9];
              fVar18 = pfVar85[10];
              fVar19 = pfVar85[0xb];
              fVar20 = pfVar83[1];
              fVar21 = pfVar83[2];
              fVar22 = pfVar83[3];
              fVar23 = pfVar83[4];
              fVar24 = pfVar83[5];
              fVar25 = pfVar83[6];
              fVar26 = pfVar83[7];
              fVar27 = pfVar83[8];
              fVar28 = pfVar83[9];
              fVar29 = pfVar83[10];
              fVar30 = pfVar83[0xb];
              fVar31 = pfVar78[1];
              fVar32 = pfVar78[2];
              fVar33 = pfVar78[3];
              fVar34 = pfVar78[4];
              fVar35 = pfVar78[5];
              fVar36 = pfVar78[6];
              fVar37 = pfVar78[7];
              fVar38 = pfVar78[8];
              fVar39 = pfVar78[9];
              fVar40 = pfVar78[10];
              fVar41 = pfVar78[0xb];
              fVar42 = pfVar78[0xc];
              fVar43 = pfVar78[0xd];
              fVar44 = pfVar78[0xe];
              fVar100 = pfVar78[0xf];
              local_c8 = (float)*(undefined8 *)(pfVar85 + 0xc);
              fStack_c4 = (float)((ulong)*(undefined8 *)(pfVar85 + 0xc) >> 0x20);
              fStack_c0 = (float)*(undefined8 *)(pfVar85 + 0xe);
              fStack_bc = (float)((ulong)*(undefined8 *)(pfVar85 + 0xe) >> 0x20);
              local_98 = (float)*(undefined8 *)(pfVar83 + 0xc);
              fStack_94 = (float)((ulong)*(undefined8 *)(pfVar83 + 0xc) >> 0x20);
              fStack_90 = (float)*(undefined8 *)(pfVar83 + 0xe);
              fStack_8c = (float)((ulong)*(undefined8 *)(pfVar83 + 0xe) >> 0x20);
              *(float *)*pauVar87 =
                   local_f8 * *pfVar85 + local_118 + fVar16 * local_d8 + fVar12 * local_e8 +
                   local_148 * *pfVar83 + fVar23 * local_128 + fVar27 * fVar57 +
                   fVar45 * *pfVar78 + fVar34 * fVar49 + fVar38 * fVar53;
              *(float *)((long)*pauVar87 + 4) =
                   fStack_f4 * fVar9 + fStack_114 + fVar17 * fStack_d4 + fVar13 * fStack_e4 +
                   fStack_144 * fVar20 + fVar24 * fStack_124 + fVar28 * fVar58 +
                   fVar46 * fVar31 + fVar35 * fVar50 + fVar39 * fVar54;
              *(float *)((long)*pauVar87 + 8) =
                   fStack_f0 * fVar10 + fStack_110 + fVar18 * fStack_d0 + fVar14 * fStack_e0 +
                   fStack_140 * fVar21 + fVar25 * fStack_120 + fVar29 * fVar59 +
                   fVar47 * fVar32 + fVar36 * fVar51 + fVar40 * fVar55;
              *(float *)((long)*pauVar87 + 0xc) =
                   fStack_ec * fVar11 + fStack_10c + fVar19 * fStack_cc + fVar15 * fStack_dc +
                   fStack_13c * fVar22 + fVar26 * fStack_11c + fVar30 * fVar60 +
                   fVar48 * fVar33 + fVar37 * fVar52 + fVar41 * fVar56;
              fVar9 = pfVar85[0x10];
              fVar10 = pfVar85[0x11];
              fVar11 = pfVar85[0x12];
              fVar20 = pfVar85[0x13];
              fVar21 = pfVar83[0x10];
              fVar22 = pfVar83[0x11];
              fVar31 = pfVar83[0x12];
              fVar32 = pfVar83[0x13];
              fVar33 = pfVar78[0x10];
              fVar102 = pfVar78[0x11];
              fVar104 = pfVar78[0x12];
              fVar105 = pfVar78[0x13];
              *(float *)pauVar87[1] =
                   fVar12 * local_f8 + local_118 + fVar23 * local_148 + fVar16 * local_e8 +
                   fVar27 * local_128 + fVar45 * fVar34 + fVar38 * fVar49 +
                   local_c8 * local_d8 + local_98 * fVar57 + fVar42 * fVar53;
              *(float *)(pauVar87[1] + 4) =
                   fVar13 * fStack_f4 + fStack_114 + fVar24 * fStack_144 + fVar17 * fStack_e4 +
                   fVar28 * fStack_124 + fVar46 * fVar35 + fVar39 * fVar50 +
                   fStack_c4 * fStack_d4 + fStack_94 * fVar58 + fVar43 * fVar54;
              *(float *)(pauVar87[1] + 8) =
                   fVar14 * fStack_f0 + fStack_110 + fVar25 * fStack_140 + fVar18 * fStack_e0 +
                   fVar29 * fStack_120 + fVar47 * fVar36 + fVar40 * fVar51 +
                   fStack_c0 * fStack_d0 + fStack_90 * fVar59 + fVar44 * fVar55;
              *(float *)(pauVar87[1] + 0xc) =
                   fVar15 * fStack_ec + fStack_10c + fVar26 * fStack_13c + fVar19 * fStack_dc +
                   fVar30 * fStack_11c + fVar48 * fVar37 + fVar41 * fVar52 +
                   fStack_bc * fStack_cc + fStack_8c * fVar60 + fVar100 * fVar56;
              fVar12 = pfVar85[0x14];
              fVar13 = pfVar85[0x15];
              fVar14 = pfVar85[0x16];
              fVar15 = pfVar85[0x17];
              fVar23 = pfVar83[0x14];
              fVar24 = pfVar83[0x15];
              fVar25 = pfVar83[0x16];
              fVar26 = pfVar83[0x17];
              fVar34 = pfVar78[0x14];
              fVar35 = pfVar78[0x15];
              fVar36 = pfVar78[0x16];
              fVar37 = pfVar78[0x17];
              *(float *)pauVar87[2] =
                   fVar33 * fVar53 + fVar9 * local_d8 + fVar21 * fVar57 +
                   fVar16 * local_f8 + local_118 + fVar27 * local_148 + fVar38 * fVar45 +
                   local_c8 * local_e8 + local_98 * local_128 + fVar42 * fVar49;
              *(float *)(pauVar87[2] + 4) =
                   fVar102 * fVar54 + fVar10 * fStack_d4 + fVar22 * fVar58 +
                   fVar17 * fStack_f4 + fStack_114 + fVar28 * fStack_144 + fVar39 * fVar46 +
                   fStack_c4 * fStack_e4 + fStack_94 * fStack_124 + fVar43 * fVar50;
              *(float *)(pauVar87[2] + 8) =
                   fVar104 * fVar55 + fVar11 * fStack_d0 + fVar31 * fVar59 +
                   fVar18 * fStack_f0 + fStack_110 + fVar29 * fStack_140 + fVar40 * fVar47 +
                   fStack_c0 * fStack_e0 + fStack_90 * fStack_120 + fVar44 * fVar51;
              *(float *)(pauVar87[2] + 0xc) =
                   fVar105 * fVar56 + fVar20 * fStack_cc + fVar32 * fVar60 +
                   fVar19 * fStack_ec + fStack_10c + fVar30 * fStack_13c + fVar41 * fVar48 +
                   fStack_bc * fStack_dc + fStack_8c * fStack_11c + fVar100 * fVar52;
              fVar16 = pfVar85[0x18];
              fVar17 = pfVar85[0x19];
              fVar18 = pfVar85[0x1a];
              fVar19 = pfVar85[0x1b];
              fVar27 = pfVar83[0x18];
              fVar28 = pfVar83[0x19];
              fVar29 = pfVar83[0x1a];
              fVar30 = pfVar83[0x1b];
              fVar38 = pfVar78[0x18];
              fVar39 = pfVar78[0x19];
              fVar40 = pfVar78[0x1a];
              fVar41 = pfVar78[0x1b];
              *(float *)pauVar87[3] =
                   local_c8 * local_f8 + local_118 + local_98 * local_148 + fVar42 * fVar45 +
                   fVar9 * local_e8 + fVar21 * local_128 + fVar33 * fVar49 +
                   fVar53 * fVar34 + fVar12 * local_d8 + fVar23 * fVar57;
              *(float *)(pauVar87[3] + 4) =
                   fStack_c4 * fStack_f4 + fStack_114 + fStack_94 * fStack_144 + fVar43 * fVar46 +
                   fVar10 * fStack_e4 + fVar22 * fStack_124 + fVar102 * fVar50 +
                   fVar54 * fVar35 + fVar13 * fStack_d4 + fVar24 * fVar58;
              *(float *)(pauVar87[3] + 8) =
                   fStack_c0 * fStack_f0 + fStack_110 + fStack_90 * fStack_140 + fVar44 * fVar47 +
                   fVar11 * fStack_e0 + fVar31 * fStack_120 + fVar104 * fVar51 +
                   fVar55 * fVar36 + fVar14 * fStack_d0 + fVar25 * fVar59;
              *(float *)(pauVar87[3] + 0xc) =
                   fStack_bc * fStack_ec + fStack_10c + fStack_8c * fStack_13c + fVar100 * fVar48 +
                   fVar20 * fStack_dc + fVar32 * fStack_11c + fVar105 * fVar52 +
                   fVar56 * fVar37 + fVar15 * fStack_cc + fVar26 * fVar60;
              fVar42 = pfVar85[0x1c];
              fVar43 = pfVar85[0x1d];
              fVar44 = pfVar85[0x1e];
              fVar100 = pfVar85[0x1f];
              fVar106 = pfVar83[0x1c];
              fVar107 = pfVar83[0x1d];
              fVar108 = pfVar83[0x1e];
              fVar109 = pfVar83[0x1f];
              fVar99 = auVar65._0_4_;
              fVar101 = auVar65._4_4_;
              fVar103 = auVar65._8_4_;
              auVar90 = *(undefined1 (*) [16])(pfVar78 + 0x1c);
              fVar95 = auVar90._0_4_;
              fVar96 = auVar90._4_4_;
              fVar97 = auVar90._8_4_;
              fVar98 = auVar90._12_4_;
              *(float *)pauVar87[4] =
                   fVar9 * local_f8 + local_118 + fVar21 * local_148 + fVar33 * fVar45 +
                   fVar12 * local_e8 + fVar23 * local_128 + fVar34 * fVar49 +
                   fVar16 * local_d8 + fVar27 * fVar57 + fVar38 * fVar53;
              *(float *)(pauVar87[4] + 4) =
                   fVar10 * fStack_f4 + fStack_114 + fVar22 * fStack_144 + fVar102 * fVar46 +
                   fVar13 * fStack_e4 + fVar24 * fStack_124 + fVar35 * fVar50 +
                   fVar17 * fStack_d4 + fVar28 * fVar58 + fVar39 * fVar54;
              *(float *)(pauVar87[4] + 8) =
                   fVar11 * fStack_f0 + fStack_110 + fVar31 * fStack_140 + fVar104 * fVar47 +
                   fVar14 * fStack_e0 + fVar25 * fStack_120 + fVar36 * fVar51 +
                   fVar18 * fStack_d0 + fVar29 * fVar59 + fVar40 * fVar55;
              *(float *)(pauVar87[4] + 0xc) =
                   fVar20 * fStack_ec + fStack_10c + fVar32 * fStack_13c + fVar105 * fVar48 +
                   fVar15 * fStack_dc + fVar26 * fStack_11c + fVar37 * fVar52 +
                   fVar19 * fStack_cc + fVar30 * fVar60 + fVar41 * fVar56;
              auVar90 = *(undefined1 (*) [16])(pfVar85 + 0x20);
              fVar9 = pfVar83[0x20];
              fVar10 = pfVar83[0x21];
              fVar11 = pfVar83[0x22];
              fVar20 = pfVar83[0x23];
              fVar21 = pfVar78[0x20];
              fVar22 = pfVar78[0x21];
              fVar31 = pfVar78[0x22];
              fVar32 = pfVar78[0x23];
              *(float *)pauVar87[5] =
                   local_f8 * fVar12 + local_118 + fVar23 * local_148 + fVar34 * fVar45 +
                   fVar16 * local_e8 + fVar27 * local_128 + fVar38 * fVar49 +
                   fVar99 * fVar42 + fVar106 * fVar57 + fVar95 * fVar53;
              *(float *)(pauVar87[5] + 4) =
                   fStack_f4 * fVar13 + fStack_114 + fVar24 * fStack_144 + fVar35 * fVar46 +
                   fVar17 * fStack_e4 + fVar28 * fStack_124 + fVar39 * fVar50 +
                   fVar101 * fVar43 + fVar107 * fVar58 + fVar96 * fVar54;
              *(float *)(pauVar87[5] + 8) =
                   fStack_f0 * fVar14 + fStack_110 + fVar25 * fStack_140 + fVar36 * fVar47 +
                   fVar18 * fStack_e0 + fVar29 * fStack_120 + fVar40 * fVar51 +
                   fVar103 * fVar44 + fVar108 * fVar59 + fVar97 * fVar55;
              *(float *)(pauVar87[5] + 0xc) =
                   fStack_ec * fVar15 + fStack_10c + fVar26 * fStack_13c + fVar37 * fVar48 +
                   fVar19 * fStack_dc + fVar30 * fStack_11c + fVar41 * fVar52 +
                   fStack_cc * fVar100 + fVar109 * fVar60 + fVar98 * fVar56;
              fVar12 = pfVar85[0x24];
              fVar13 = pfVar85[0x25];
              fVar14 = pfVar85[0x26];
              fVar15 = pfVar85[0x27];
              fVar23 = pfVar83[0x24];
              fVar24 = pfVar83[0x25];
              fVar25 = pfVar83[0x26];
              fVar26 = pfVar83[0x27];
              fVar33 = pfVar78[0x24];
              fVar34 = pfVar78[0x25];
              fVar35 = pfVar78[0x26];
              fVar36 = pfVar78[0x27];
              *(float *)pauVar87[6] =
                   local_f8 * fVar16 + local_118 + fVar45 * fVar38 + fVar27 * local_148 +
                   fVar42 * local_e8 + fVar106 * local_128 + fVar95 * fVar49 +
                   auVar90._0_4_ * fVar99 + fVar9 * fVar57 + fVar21 * fVar53;
              *(float *)(pauVar87[6] + 4) =
                   fStack_f4 * fVar17 + fStack_114 + fVar46 * fVar39 + fVar28 * fStack_144 +
                   fVar43 * fStack_e4 + fVar107 * fStack_124 + fVar96 * fVar50 +
                   auVar90._4_4_ * fVar101 + fVar10 * fVar58 + fVar22 * fVar54;
              *(float *)(pauVar87[6] + 8) =
                   fStack_f0 * fVar18 + fStack_110 + fVar47 * fVar40 + fVar29 * fStack_140 +
                   fVar44 * fStack_e0 + fVar108 * fStack_120 + fVar97 * fVar51 +
                   auVar90._8_4_ * fVar103 + fVar11 * fVar59 + fVar31 * fVar55;
              *(float *)(pauVar87[6] + 0xc) =
                   fStack_ec * fVar19 + fStack_10c + fVar48 * fVar41 + fVar30 * fStack_13c +
                   fVar100 * fStack_dc + fVar109 * fStack_11c + fVar98 * fVar52 +
                   auVar90._12_4_ * fStack_cc + fVar20 * fVar60 + fVar32 * fVar56;
              auVar89._0_4_ =
                   local_f8 * fVar42 + local_118 + fVar106 * local_148 + fVar95 * fVar45 +
                   auVar90._0_4_ * local_e8 + fVar9 * local_128 + fVar21 * fVar49 +
                   fVar99 * fVar12 + fVar57 * fVar23 + fVar53 * fVar33;
              auVar89._4_4_ =
                   fStack_f4 * fVar43 + fStack_114 + fVar107 * fStack_144 + fVar96 * fVar46 +
                   auVar90._4_4_ * fStack_e4 + fVar10 * fStack_124 + fVar22 * fVar50 +
                   fVar101 * fVar13 + fVar58 * fVar24 + fVar54 * fVar34;
              auVar89._8_4_ =
                   fStack_f0 * fVar44 + fStack_110 + fVar108 * fStack_140 + fVar97 * fVar47 +
                   auVar90._8_4_ * fStack_e0 + fVar11 * fStack_120 + fVar31 * fVar51 +
                   fVar103 * fVar14 + fVar59 * fVar25 + fVar55 * fVar35;
              auVar89._12_4_ =
                   fStack_ec * fVar100 + fStack_10c + fVar109 * fStack_13c + fVar98 * fVar48 +
                   auVar90._12_4_ * fStack_dc + fVar20 * fStack_11c + fVar32 * fVar52 +
                   fStack_cc * fVar15 + fVar60 * fVar26 + fVar56 * fVar36;
              pauVar87[7] = auVar89;
              pfVar85 = pfVar85 + 0x20;
              pfVar83 = pfVar83 + 0x20;
              pfVar78 = pfVar78 + 0x20;
              pauVar87 = pauVar87 + 8;
              iVar74 = iVar74 + 8;
              uVar76 = uVar7 & 0xfffffff8;
            } while (iVar74 < (int)uVar7);
          }
          if ((int)(uVar76 | 3) < (int)uVar7) {
            lVar77 = 0;
            uVar75 = uVar76;
            do {
              lVar82 = lVar77;
              pfVar3 = (float *)((long)pfVar85 + lVar82);
              fVar12 = pfVar3[1];
              fVar13 = pfVar3[2];
              fVar14 = pfVar3[3];
              pfVar79 = (float *)((long)pfVar85 + lVar82 + 0x10);
              fVar15 = *pfVar79;
              fVar16 = pfVar79[1];
              fVar17 = pfVar79[2];
              fVar18 = pfVar79[3];
              auVar90 = *(undefined1 (*) [16])((long)pfVar85 + lVar82 + 0x20);
              puVar2 = (undefined8 *)((long)pfVar85 + lVar82 + 0x30);
              uVar61 = *puVar2;
              uVar62 = puVar2[1];
              fVar105 = auVar66._0_4_;
              fVar106 = auVar66._4_4_;
              fVar107 = auVar66._8_4_;
              fVar9 = auVar67._0_4_;
              fVar108 = auVar90._0_4_;
              fVar10 = auVar67._4_4_;
              fVar109 = auVar90._4_4_;
              fVar11 = auVar67._8_4_;
              fVar95 = auVar90._8_4_;
              fVar96 = auVar90._12_4_;
              pfVar79 = (float *)((long)pfVar83 + lVar82);
              fVar19 = pfVar79[1];
              fVar20 = pfVar79[2];
              fVar21 = pfVar79[3];
              pfVar84 = (float *)((long)pfVar83 + lVar82 + 0x10);
              fVar22 = *pfVar84;
              fVar23 = pfVar84[1];
              fVar24 = pfVar84[2];
              fVar25 = pfVar84[3];
              pfVar84 = (float *)((long)pfVar83 + lVar82 + 0x20);
              fVar26 = *pfVar84;
              fVar27 = pfVar84[1];
              fVar28 = pfVar84[2];
              fVar29 = pfVar84[3];
              pfVar84 = (float *)((long)pfVar83 + lVar82 + 0x30);
              fVar30 = *pfVar84;
              fVar31 = pfVar84[1];
              fVar32 = pfVar84[2];
              fVar33 = pfVar84[3];
              pfVar84 = (float *)((long)pfVar78 + lVar82);
              fVar34 = pfVar84[1];
              fVar35 = pfVar84[2];
              fVar36 = pfVar84[3];
              fVar100 = auVar73._0_4_;
              fVar102 = auVar73._4_4_;
              fVar104 = auVar73._8_4_;
              pfVar86 = (float *)((long)pfVar78 + lVar82 + 0x10);
              fVar37 = *pfVar86;
              fVar38 = pfVar86[1];
              fVar39 = pfVar86[2];
              fVar40 = pfVar86[3];
              pfVar86 = (float *)((long)pfVar78 + lVar82 + 0x20);
              fVar41 = *pfVar86;
              fVar42 = pfVar86[1];
              fVar43 = pfVar86[2];
              fVar44 = pfVar86[3];
              puVar2 = (undefined8 *)((long)pfVar78 + lVar82 + 0x30);
              uVar63 = *puVar2;
              uVar64 = puVar2[1];
              pfVar86 = (float *)((long)*pauVar87 + lVar82);
              *pfVar86 = local_f8 * *pfVar3 + local_118 + fVar105 * fVar15 + fVar108 * fVar9 +
                         local_148 * *pfVar79 + local_128 * fVar22 + fVar57 * fVar26 +
                         fVar41 * fVar53 + fVar37 * fVar49 + fVar100 * *pfVar84;
              pfVar86[1] = fStack_f4 * fVar12 + fStack_114 + fVar106 * fVar16 + fVar109 * fVar10 +
                           fStack_144 * fVar19 + fStack_124 * fVar23 + fVar58 * fVar27 +
                           fVar42 * fVar54 + fVar38 * fVar50 + fVar102 * fVar34;
              pfVar86[2] = fStack_f0 * fVar13 + fStack_110 + fVar107 * fVar17 + fVar95 * fVar11 +
                           fStack_140 * fVar20 + fStack_120 * fVar24 + fVar59 * fVar28 +
                           fVar43 * fVar55 + fVar39 * fVar51 + fVar104 * fVar35;
              pfVar86[3] = fStack_ec * fVar14 + fStack_10c + fStack_dc * fVar18 + fVar96 * fStack_cc
                           + fStack_13c * fVar21 + fStack_11c * fVar25 + fVar60 * fVar29 +
                           fVar44 * fVar56 + fVar40 * fVar52 + fVar48 * fVar36;
              local_c8 = (float)uVar61;
              fStack_c4 = (float)((ulong)uVar61 >> 0x20);
              fStack_c0 = (float)uVar62;
              fStack_bc = (float)((ulong)uVar62 >> 0x20);
              local_98 = (float)uVar63;
              fStack_94 = (float)((ulong)uVar63 >> 0x20);
              fStack_90 = (float)uVar64;
              fStack_8c = (float)((ulong)uVar64 >> 0x20);
              pfVar79 = (float *)((long)pfVar85 + lVar82 + 0x40);
              fVar12 = *pfVar79;
              fVar13 = pfVar79[1];
              fVar14 = pfVar79[2];
              fVar19 = pfVar79[3];
              pfVar79 = (float *)((long)pfVar83 + lVar82 + 0x40);
              fVar20 = *pfVar79;
              fVar21 = pfVar79[1];
              fVar34 = pfVar79[2];
              fVar35 = pfVar79[3];
              pauVar1 = (undefined1 (*) [12])((long)pfVar78 + lVar82 + 0x40);
              auVar69 = *pauVar1;
              fStack_6c = (float)((ulong)*(undefined8 *)(*pauVar1 + 8) >> 0x20);
              pfVar79 = (float *)(pauVar87[1] + lVar82);
              *pfVar79 = fVar15 * local_f8 + local_118 + fVar108 * fVar105 + fVar22 * local_148 +
                         fVar26 * local_128 + fVar37 * fVar100 + fVar41 * fVar49 +
                         fVar9 * local_c8 + fVar30 * fVar57 + fVar53 * local_98;
              pfVar79[1] = fVar16 * fStack_f4 + fStack_114 + fVar109 * fVar106 + fVar23 * fStack_144
                           + fVar27 * fStack_124 + fVar38 * fVar102 + fVar42 * fVar50 +
                           fVar10 * fStack_c4 + fVar31 * fVar58 + fVar54 * fStack_94;
              pfVar79[2] = fVar17 * fStack_f0 + fStack_110 + fVar95 * fVar107 + fVar24 * fStack_140
                           + fVar28 * fStack_120 + fVar39 * fVar104 + fVar43 * fVar51 +
                           fVar11 * fStack_c0 + fVar32 * fVar59 + fVar55 * fStack_90;
              pfVar79[3] = fVar18 * fStack_ec + fStack_10c +
                           fVar96 * fStack_dc + fVar25 * fStack_13c +
                           fVar29 * fStack_11c + fVar40 * fVar48 + fVar44 * fVar52 +
                           fStack_cc * fStack_bc + fVar33 * fVar60 + fVar56 * fStack_8c;
              pfVar79 = (float *)((long)pfVar85 + lVar82 + 0x50);
              fVar15 = *pfVar79;
              fVar16 = pfVar79[1];
              fVar17 = pfVar79[2];
              fVar18 = pfVar79[3];
              pfVar79 = (float *)((long)pfVar83 + lVar82 + 0x50);
              fVar22 = *pfVar79;
              fVar23 = pfVar79[1];
              fVar24 = pfVar79[2];
              fVar25 = pfVar79[3];
              pfVar79 = (float *)((long)pfVar78 + lVar82 + 0x50);
              fVar36 = *pfVar79;
              fVar37 = pfVar79[1];
              fVar38 = pfVar79[2];
              fVar39 = pfVar79[3];
              pfVar79 = (float *)(pauVar87[2] + lVar82);
              *pfVar79 = fVar108 * auVar68._0_4_ + local_118 + fVar26 * local_148 + fVar41 * fVar100
                         + fVar105 * local_c8 + fVar30 * local_128 + local_98 * fVar49 +
                         fVar12 * fVar9 + fVar20 * fVar57 + auVar69._0_4_ * fVar53;
              pfVar79[1] = fVar109 * auVar68._4_4_ + fStack_114 +
                           fVar27 * fStack_144 + fVar42 * fVar102 +
                           fVar106 * fStack_c4 + fVar31 * fStack_124 + fStack_94 * fVar50 +
                           fVar13 * fVar10 + fVar21 * fVar58 + auVar69._4_4_ * fVar54;
              pfVar79[2] = fVar95 * auVar68._8_4_ + fStack_110 +
                           fVar28 * fStack_140 + fVar43 * fVar104 +
                           fVar107 * fStack_c0 + fVar32 * fStack_120 + fStack_90 * fVar51 +
                           fVar14 * fVar11 + fVar34 * fVar59 + auVar69._8_4_ * fVar55;
              pfVar79[3] = fVar96 * fStack_ec + fStack_10c + fVar29 * fStack_13c + fVar44 * fVar48 +
                           fStack_dc * fStack_bc + fVar33 * fStack_11c + fStack_8c * fVar52 +
                           fVar19 * fStack_cc + fVar35 * fVar60 + fStack_6c * fVar56;
              auVar90._0_4_ =
                   auVar68._0_4_ * local_c8 + local_118 + fVar30 * local_148 + fVar100 * local_98 +
                   fVar12 * fVar105 + fVar20 * local_128 + auVar69._0_4_ * fVar49 +
                   fVar9 * fVar15 + fVar57 * fVar22 + fVar53 * fVar36;
              auVar90._4_4_ =
                   auVar68._4_4_ * fStack_c4 + fStack_114 +
                   fVar31 * fStack_144 + fVar102 * fStack_94 +
                   fVar13 * fVar106 + fVar21 * fStack_124 + auVar69._4_4_ * fVar50 +
                   fVar10 * fVar16 + fVar58 * fVar23 + fVar54 * fVar37;
              auVar90._8_4_ =
                   auVar68._8_4_ * fStack_c0 + fStack_110 +
                   fVar32 * fStack_140 + fVar104 * fStack_90 +
                   fVar14 * fVar107 + fVar34 * fStack_120 + auVar69._8_4_ * fVar51 +
                   fVar11 * fVar17 + fVar59 * fVar24 + fVar55 * fVar38;
              auVar90._12_4_ =
                   fStack_ec * fStack_bc + fStack_10c + fVar33 * fStack_13c + fVar48 * fStack_8c +
                   fVar19 * fStack_dc + fVar35 * fStack_11c + fStack_6c * fVar52 +
                   fStack_cc * fVar18 + fVar60 * fVar25 + fVar56 * fVar39;
              *(undefined1 (*) [16])(pauVar87[3] + lVar82) = auVar90;
              uVar76 = uVar75 + 4;
              iVar74 = uVar75 + 7;
              lVar77 = lVar82 + 0x40;
              uVar75 = uVar76;
            } while (iVar74 < (int)uVar7);
            pfVar78 = (float *)((long)pfVar78 + lVar77);
            pfVar83 = (float *)((long)pfVar83 + lVar77);
            pfVar85 = (float *)((long)pfVar85 + lVar77);
            pauVar87 = (undefined1 (*) [16])(pauVar87[4] + lVar82);
          }
          if ((int)(uVar76 | 1) < (int)uVar7) {
            lVar77 = 0;
            uVar75 = uVar76;
            do {
              lVar82 = lVar77;
              pfVar79 = (float *)((long)pfVar85 + lVar82 + 0x10);
              fVar9 = *pfVar79;
              fVar10 = pfVar79[1];
              fVar11 = pfVar79[2];
              fVar12 = pfVar79[3];
              pfVar79 = (float *)((long)pfVar85 + lVar82 + 0x20);
              fVar13 = *pfVar79;
              fVar14 = pfVar79[1];
              fVar15 = pfVar79[2];
              fVar16 = pfVar79[3];
              pfVar79 = (float *)((long)pfVar83 + lVar82 + 0x10);
              fVar17 = *pfVar79;
              fVar18 = pfVar79[1];
              fVar19 = pfVar79[2];
              fVar20 = pfVar79[3];
              pfVar79 = (float *)((long)pfVar83 + lVar82 + 0x20);
              fVar21 = *pfVar79;
              fVar22 = pfVar79[1];
              fVar23 = pfVar79[2];
              fVar24 = pfVar79[3];
              pfVar79 = (float *)((long)pfVar78 + lVar82 + 0x10);
              fVar25 = *pfVar79;
              fVar26 = pfVar79[1];
              fVar27 = pfVar79[2];
              fVar28 = pfVar79[3];
              pfVar86 = (float *)((long)pfVar85 + lVar82);
              pfVar79 = (float *)((long)pfVar78 + lVar82 + 0x20);
              fVar29 = *pfVar79;
              fVar30 = pfVar79[1];
              fVar31 = pfVar79[2];
              fVar32 = pfVar79[3];
              pfVar79 = (float *)((long)pfVar83 + lVar82);
              pfVar84 = (float *)((long)pfVar78 + lVar82);
              auVar94._0_4_ =
                   fVar45 * *pfVar84 + fVar25 * fVar49 + fVar29 * fVar53 +
                   local_148 * *pfVar79 + fVar17 * local_128 + fVar21 * fVar57 +
                   fVar9 * auVar71._0_4_ + auVar72._0_4_ * fVar13 +
                   local_118 + auVar70._0_4_ * *pfVar86;
              auVar94._4_4_ =
                   fVar46 * pfVar84[1] + fVar26 * fVar50 + fVar30 * fVar54 +
                   fStack_144 * pfVar79[1] + fVar18 * fStack_124 + fVar22 * fVar58 +
                   fVar10 * auVar71._4_4_ + auVar72._4_4_ * fVar14 +
                   fStack_114 + auVar70._4_4_ * pfVar86[1];
              auVar94._8_4_ =
                   fVar47 * pfVar84[2] + fVar27 * fVar51 + fVar31 * fVar55 +
                   fStack_140 * pfVar79[2] + fVar19 * fStack_120 + fVar23 * fVar59 +
                   fVar11 * auVar71._8_4_ + auVar72._8_4_ * fVar15 +
                   fStack_110 + auVar70._8_4_ * pfVar86[2];
              auVar94._12_4_ =
                   fVar48 * pfVar84[3] + fVar28 * fVar52 + fVar32 * fVar56 +
                   fStack_13c * pfVar79[3] + fVar20 * fStack_11c + fVar24 * fVar60 +
                   fVar12 * fStack_dc + fStack_cc * fVar16 + fStack_10c + fStack_ec * pfVar86[3];
              pfVar79 = (float *)((long)pfVar85 + lVar82 + 0x30);
              fVar33 = *pfVar79;
              fVar34 = pfVar79[1];
              fVar35 = pfVar79[2];
              fVar36 = pfVar79[3];
              pfVar79 = (float *)((long)pfVar83 + lVar82 + 0x30);
              fVar37 = *pfVar79;
              fVar38 = pfVar79[1];
              fVar39 = pfVar79[2];
              fVar40 = pfVar79[3];
              pfVar79 = (float *)((long)pfVar78 + lVar82 + 0x30);
              fVar41 = *pfVar79;
              fVar42 = pfVar79[1];
              fVar43 = pfVar79[2];
              fVar44 = pfVar79[3];
              *(undefined1 (*) [16])((long)*pauVar87 + lVar82) = auVar94;
              auVar91._0_4_ =
                   auVar72._0_4_ * fVar33 + fVar57 * fVar37 + fVar53 * fVar41 +
                   local_118 + fVar9 * auVar70._0_4_ + auVar71._0_4_ * fVar13 + local_148 * fVar17 +
                   local_128 * fVar21 + fVar25 * fVar45 + fVar29 * fVar49;
              auVar91._4_4_ =
                   auVar72._4_4_ * fVar34 + fVar58 * fVar38 + fVar54 * fVar42 +
                   fStack_114 + fVar10 * auVar70._4_4_ +
                   auVar71._4_4_ * fVar14 + fStack_144 * fVar18 +
                   fStack_124 * fVar22 + fVar26 * fVar46 + fVar30 * fVar50;
              auVar91._8_4_ =
                   auVar72._8_4_ * fVar35 + fVar59 * fVar39 + fVar55 * fVar43 +
                   fStack_110 + fVar11 * auVar70._8_4_ +
                   auVar71._8_4_ * fVar15 + fStack_140 * fVar19 +
                   fStack_120 * fVar23 + fVar27 * fVar47 + fVar31 * fVar51;
              auVar91._12_4_ =
                   fStack_cc * fVar36 + fVar60 * fVar40 + fVar56 * fVar44 +
                   fStack_10c + fVar12 * fStack_ec + fStack_dc * fVar16 + fStack_13c * fVar20 +
                   fStack_11c * fVar24 + fVar28 * fVar48 + fVar32 * fVar52;
              *(undefined1 (*) [16])(pauVar87[1] + lVar82) = auVar91;
              uVar76 = uVar75 + 2;
              iVar74 = uVar75 + 3;
              lVar77 = lVar82 + 0x20;
              uVar75 = uVar76;
            } while (iVar74 < (int)uVar7);
            pfVar78 = (float *)((long)pfVar78 + lVar77);
            pfVar83 = (float *)((long)pfVar83 + lVar77);
            pfVar85 = (float *)((long)pfVar85 + lVar77);
            pauVar87 = (undefined1 (*) [16])(pauVar87[2] + lVar82);
          }
          iVar74 = uVar7 - uVar76;
          pfVar79 = pfVar78;
          pfVar84 = pfVar83;
          pfVar86 = pfVar85;
          if (iVar74 != 0 && (int)uVar76 <= (int)uVar7) {
            do {
              pfVar85 = pfVar86 + 4;
              pfVar83 = pfVar84 + 4;
              pfVar78 = pfVar79 + 4;
              auVar92._0_4_ =
                   local_f8 * *pfVar86 + local_118 + local_e8 * pfVar86[4] + local_d8 * pfVar86[8] +
                   local_148 * *pfVar84 + local_128 * pfVar84[4] + fVar57 * pfVar84[8] +
                   fVar45 * *pfVar79 + fVar49 * pfVar79[4] + fVar53 * pfVar79[8];
              auVar92._4_4_ =
                   fStack_f4 * pfVar86[1] + fStack_114 +
                   fStack_e4 * pfVar86[5] + fStack_d4 * pfVar86[9] +
                   fStack_144 * pfVar84[1] + fStack_124 * pfVar84[5] + fVar58 * pfVar84[9] +
                   fVar46 * pfVar79[1] + fVar50 * pfVar79[5] + fVar54 * pfVar79[9];
              auVar92._8_4_ =
                   fStack_f0 * pfVar86[2] + fStack_110 +
                   fStack_e0 * pfVar86[6] + fStack_d0 * pfVar86[10] +
                   fStack_140 * pfVar84[2] + fStack_120 * pfVar84[6] + fVar59 * pfVar84[10] +
                   fVar47 * pfVar79[2] + fVar51 * pfVar79[6] + fVar55 * pfVar79[10];
              auVar92._12_4_ =
                   fStack_ec * pfVar86[3] + fStack_10c +
                   fStack_dc * pfVar86[7] + fStack_cc * pfVar86[0xb] +
                   fStack_13c * pfVar84[3] + fStack_11c * pfVar84[7] + fVar60 * pfVar84[0xb] +
                   fVar48 * pfVar79[3] + fVar52 * pfVar79[7] + fVar56 * pfVar79[0xb];
              *pauVar87 = auVar92;
              pauVar87 = pauVar87 + 1;
              iVar74 = iVar74 + -1;
              pfVar79 = pfVar78;
              pfVar84 = pfVar83;
              pfVar86 = pfVar85;
            } while (iVar74 != 0);
          }
          pfVar85 = pfVar85 + 8;
          pfVar83 = pfVar83 + 8;
          pfVar78 = pfVar78 + 8;
          iVar80 = iVar80 + 1;
        } while (iVar80 != iVar8);
      }
      lVar81 = lVar81 + 1;
    } while (lVar81 != iVar6);
  }
  return;
}

Assistant:

static void convdw3x3s1_pack4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m128 _bias0 = bias ? _mm_loadu_ps((const float*)bias + g * 4) : _mm_set1_ps(0.f);

        const float* k0 = kernel.row(g);

        float* outptr0 = out.row(0);

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);

        __m128 _k00 = _mm_load_ps(k0);
        __m128 _k01 = _mm_load_ps(k0 + 4);
        __m128 _k02 = _mm_load_ps(k0 + 8);
        __m128 _k10 = _mm_load_ps(k0 + 12);
        __m128 _k11 = _mm_load_ps(k0 + 16);
        __m128 _k12 = _mm_load_ps(k0 + 20);
        __m128 _k20 = _mm_load_ps(k0 + 24);
        __m128 _k21 = _mm_load_ps(k0 + 28);
        __m128 _k22 = _mm_load_ps(k0 + 32);

        int i = 0;

        for (; i < outh; i++)
        {
            int j = 0;
            for (; j + 7 < outw; j += 8)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_load_ps(r0);
                __m128 _r01 = _mm_load_ps(r0 + 4);
                __m128 _r02 = _mm_load_ps(r0 + 8);
                __m128 _r10 = _mm_load_ps(r1);
                __m128 _r11 = _mm_load_ps(r1 + 4);
                __m128 _r12 = _mm_load_ps(r1 + 8);
                __m128 _r20 = _mm_load_ps(r2);
                __m128 _r21 = _mm_load_ps(r2 + 4);
                __m128 _r22 = _mm_load_ps(r2 + 8);

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);

                __m128 _sum1 = _bias0;
                __m128 _r03 = _mm_load_ps(r0 + 12);
                __m128 _r13 = _mm_load_ps(r1 + 12);
                __m128 _r23 = _mm_load_ps(r2 + 12);
                _mm_store_ps(outptr0, _sum0);

                _sum1 = _mm_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k02, _r03, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k12, _r13, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k22, _r23, _sum1);

                __m128 _sum2 = _bias0;
                __m128 _r04 = _mm_load_ps(r0 + 16);
                __m128 _r14 = _mm_load_ps(r1 + 16);
                __m128 _r24 = _mm_load_ps(r2 + 16);
                _mm_store_ps(outptr0 + 4, _sum1);

                _sum2 = _mm_comp_fmadd_ps(_k00, _r02, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k01, _r03, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k02, _r04, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k10, _r12, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k11, _r13, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k12, _r14, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k20, _r22, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k21, _r23, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k22, _r24, _sum2);

                __m128 _sum3 = _bias0;
                __m128 _r05 = _mm_load_ps(r0 + 20);
                __m128 _r15 = _mm_load_ps(r1 + 20);
                __m128 _r25 = _mm_load_ps(r2 + 20);
                _mm_store_ps(outptr0 + 8, _sum2);

                _sum3 = _mm_comp_fmadd_ps(_k00, _r03, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k01, _r04, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k02, _r05, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k10, _r13, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k11, _r14, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k12, _r15, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k20, _r23, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k21, _r24, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k22, _r25, _sum3);

                __m128 _sum4 = _bias0;
                __m128 _r06 = _mm_load_ps(r0 + 24);
                __m128 _r16 = _mm_load_ps(r1 + 24);
                __m128 _r26 = _mm_load_ps(r2 + 24);
                _mm_store_ps(outptr0 + 12, _sum3);

                _sum4 = _mm_comp_fmadd_ps(_k00, _r04, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k01, _r05, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k02, _r06, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k10, _r14, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k11, _r15, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k12, _r16, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k20, _r24, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k21, _r25, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k22, _r26, _sum4);

                __m128 _sum5 = _bias0;
                __m128 _r07 = _mm_load_ps(r0 + 28);
                __m128 _r17 = _mm_load_ps(r1 + 28);
                __m128 _r27 = _mm_load_ps(r2 + 28);
                _mm_store_ps(outptr0 + 16, _sum4);

                _sum5 = _mm_comp_fmadd_ps(_k00, _r05, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k01, _r06, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k02, _r07, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k10, _r15, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k11, _r16, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k12, _r17, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k20, _r25, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k21, _r26, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k22, _r27, _sum5);

                __m128 _sum6 = _bias0;
                __m128 _r08 = _mm_load_ps(r0 + 32);
                __m128 _r18 = _mm_load_ps(r1 + 32);
                __m128 _r28 = _mm_load_ps(r2 + 32);
                _mm_store_ps(outptr0 + 20, _sum5);

                _sum6 = _mm_comp_fmadd_ps(_k00, _r06, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k01, _r07, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k02, _r08, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k10, _r16, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k11, _r17, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k12, _r18, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k20, _r26, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k21, _r27, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k22, _r28, _sum6);

                __m128 _sum7 = _bias0;
                __m128 _r09 = _mm_load_ps(r0 + 36);
                __m128 _r19 = _mm_load_ps(r1 + 36);
                __m128 _r29 = _mm_load_ps(r2 + 36);
                _mm_store_ps(outptr0 + 24, _sum6);

                _sum7 = _mm_comp_fmadd_ps(_k00, _r07, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k01, _r08, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k02, _r09, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k10, _r17, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k11, _r18, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k12, _r19, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k20, _r27, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k21, _r28, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k22, _r29, _sum7);
                _mm_store_ps(outptr0 + 28, _sum7);

                r0 += 32;
                r1 += 32;
                r2 += 32;
                outptr0 += 32;
            }
            for (; j + 3 < outw; j += 4)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_load_ps(r0);
                __m128 _r01 = _mm_load_ps(r0 + 4);
                __m128 _r02 = _mm_load_ps(r0 + 8);
                __m128 _r10 = _mm_load_ps(r1);
                __m128 _r11 = _mm_load_ps(r1 + 4);
                __m128 _r12 = _mm_load_ps(r1 + 8);
                __m128 _r20 = _mm_load_ps(r2);
                __m128 _r21 = _mm_load_ps(r2 + 4);
                __m128 _r22 = _mm_load_ps(r2 + 8);

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);

                __m128 _sum1 = _bias0;
                __m128 _r03 = _mm_load_ps(r0 + 12);
                __m128 _r13 = _mm_load_ps(r1 + 12);
                __m128 _r23 = _mm_load_ps(r2 + 12);
                _mm_store_ps(outptr0, _sum0);

                _sum1 = _mm_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k02, _r03, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k12, _r13, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k22, _r23, _sum1);

                __m128 _sum2 = _bias0;
                __m128 _r04 = _mm_load_ps(r0 + 16);
                __m128 _r14 = _mm_load_ps(r1 + 16);
                __m128 _r24 = _mm_load_ps(r2 + 16);
                _mm_store_ps(outptr0 + 4, _sum1);

                _sum2 = _mm_comp_fmadd_ps(_k00, _r02, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k01, _r03, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k02, _r04, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k10, _r12, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k11, _r13, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k12, _r14, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k20, _r22, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k21, _r23, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k22, _r24, _sum2);

                __m128 _sum3 = _bias0;
                __m128 _r05 = _mm_load_ps(r0 + 20);
                __m128 _r15 = _mm_load_ps(r1 + 20);
                __m128 _r25 = _mm_load_ps(r2 + 20);
                _mm_store_ps(outptr0 + 8, _sum2);

                _sum3 = _mm_comp_fmadd_ps(_k00, _r03, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k01, _r04, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k02, _r05, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k10, _r13, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k11, _r14, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k12, _r15, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k20, _r23, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k21, _r24, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k22, _r25, _sum3);

                _mm_store_ps(outptr0 + 12, _sum3);

                r0 += 16;
                r1 += 16;
                r2 += 16;
                outptr0 += 16;
            }
            for (; j + 1 < outw; j += 2)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_load_ps(r0);
                __m128 _r01 = _mm_load_ps(r0 + 4);
                __m128 _r02 = _mm_load_ps(r0 + 8);
                __m128 _r10 = _mm_load_ps(r1);
                __m128 _r11 = _mm_load_ps(r1 + 4);
                __m128 _r12 = _mm_load_ps(r1 + 8);
                __m128 _r20 = _mm_load_ps(r2);
                __m128 _r21 = _mm_load_ps(r2 + 4);
                __m128 _r22 = _mm_load_ps(r2 + 8);

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);

                __m128 _sum1 = _bias0;
                __m128 _r03 = _mm_load_ps(r0 + 12);
                __m128 _r13 = _mm_load_ps(r1 + 12);
                __m128 _r23 = _mm_load_ps(r2 + 12);
                _mm_store_ps(outptr0, _sum0);

                _sum1 = _mm_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k02, _r03, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k12, _r13, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k22, _r23, _sum1);

                _mm_store_ps(outptr0 + 4, _sum1);

                r0 += 8;
                r1 += 8;
                r2 += 8;
                outptr0 += 8;
            }
            for (; j < outw; j++)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_load_ps(r0);
                __m128 _r01 = _mm_load_ps(r0 + 4);
                __m128 _r02 = _mm_load_ps(r0 + 8);
                __m128 _r10 = _mm_load_ps(r1);
                __m128 _r11 = _mm_load_ps(r1 + 4);
                __m128 _r12 = _mm_load_ps(r1 + 8);
                __m128 _r20 = _mm_load_ps(r2);
                __m128 _r21 = _mm_load_ps(r2 + 4);
                __m128 _r22 = _mm_load_ps(r2 + 8);

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);

                _mm_store_ps(outptr0, _sum0);

                r0 += 4;
                r1 += 4;
                r2 += 4;
                outptr0 += 4;
            }

            r0 += 2 * 4;
            r1 += 2 * 4;
            r2 += 2 * 4;
        }
    }
}